

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O0

void __thiscall Time::add(Time *this,Estimator *object)

{
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  bool bVar4;
  uint local_20;
  uint i;
  bool found;
  Estimator *object_local;
  Time *this_local;
  
  bVar1 = false;
  local_20 = 0;
  _i = object;
  object_local = (Estimator *)this;
  while( true ) {
    bVar4 = false;
    if (!bVar1) {
      sVar2 = std::vector<Estimator_*,_std::allocator<Estimator_*>_>::size(&this->timeEstimators);
      bVar4 = local_20 < sVar2;
    }
    if (!bVar4) break;
    ppEVar3 = std::vector<Estimator_*,_std::allocator<Estimator_*>_>::operator[]
                        (&this->timeEstimators,(ulong)local_20);
    if (*ppEVar3 == _i) {
      bVar1 = true;
    }
    local_20 = local_20 + 1;
  }
  if (!bVar1) {
    std::vector<Estimator_*,_std::allocator<Estimator_*>_>::push_back
              (&this->timeEstimators,(value_type *)&i);
  }
  return;
}

Assistant:

void Time::add( class Estimator *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeEstimators.size(); ++i)
		if (timeEstimators[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeEstimators.push_back( object );
}